

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O2

Vector3d *
sdf::SDFGradientPosNorm
          (Vector3d *__return_storage_ptr__,Vector3d *location,
          vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined8 local_1a8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_198 [16];
  double local_188;
  Vector3d *local_178;
  undefined8 *local_170;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_160 [24];
  Vector3d *local_148;
  undefined8 *local_140;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_130 [24];
  Vector3d *local_118;
  undefined8 *local_110;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_100 [24];
  Vector3d *local_e8;
  undefined4 *local_e0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_d0 [24];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  Vector3d *local_a0;
  undefined8 *local_98;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_88 [24];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Vector3d *local_58;
  undefined8 *local_50;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_40 [24];
  
  local_50 = &local_70;
  local_70 = 0x3ee4f8b588e368f1;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_40,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_58);
  dVar1 = SDF((Vector3d *)local_40,primitives);
  local_98 = &local_b8;
  local_b8 = 0x3ee4f8b588e368f1;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_88,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_a0);
  dVar2 = SDF((Vector3d *)local_88,primitives);
  local_e0 = &local_1b8;
  local_1b8 = 0;
  uStack_1b4 = 0;
  uStack_1b0 = 0x88e368f1;
  uStack_1ac = 0x3ee4f8b5;
  local_1a8 = 0;
  local_e8 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_d0,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_e8);
  dVar3 = SDF((Vector3d *)local_d0,primitives);
  local_110 = &local_1d8;
  local_1d8 = 0;
  uStack_1d0 = 0x3ee4f8b588e368f1;
  local_1c8 = 0;
  local_118 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_100,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_118);
  dVar4 = SDF((Vector3d *)local_100,primitives);
  local_140 = &local_1f8;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 0x3ee4f8b588e368f1;
  local_148 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_130,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_148);
  dVar5 = SDF((Vector3d *)local_130,primitives);
  local_170 = &local_218;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0x3ee4f8b588e368f1;
  local_178 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_160,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_178);
  dVar6 = SDF((Vector3d *)local_160,primitives);
  local_188 = ABS(dVar5 - dVar6) / 2e-05;
  local_198._8_4_ = SUB84(ABS(dVar3 - dVar4),0);
  local_198._0_8_ = ABS(dVar1 - dVar2);
  local_198._12_4_ = (int)((ulong)ABS(dVar3 - dVar4) >> 0x20);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
            (__return_storage_ptr__,local_198);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d 
  SDFGradientPosNorm(const Eigen::Vector3d &location,  std::vector<Primitive*> &primitives)
  {
    double delta=1e-05;
    Eigen::Vector3d v = Eigen::Vector3d(
           fabs(SDF(location + Eigen::Vector3d(delta,0,0), primitives) - SDF(location - Eigen::Vector3d(delta,0,0), primitives)),
           fabs(SDF(location + Eigen::Vector3d(0,delta,0), primitives) - SDF(location - Eigen::Vector3d(0,delta,0), primitives)),
           fabs(SDF(location + Eigen::Vector3d(0,0,delta), primitives) - SDF(location - Eigen::Vector3d(0,0,delta), primitives))/(2.0*delta));
    return v.normalized();
  }